

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

bool compareDir(string *a,string *b)

{
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  undefined1 local_19 [8];
  bool ok;
  
  local_19[0] = 1;
  local_38 = (code *)0x0;
  pcStack_30 = (code *)0x0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_48._M_unused._M_object = operator_new(0x18);
  *(string **)local_48._M_unused._0_8_ = a;
  *(string **)((long)local_48._M_unused._0_8_ + 8) = b;
  *(undefined1 **)((long)local_48._M_unused._0_8_ + 0x10) = local_19;
  pcStack_30 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sasq64[P]fastzip/src/test.cpp:72:18)>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sasq64[P]fastzip/src/test.cpp:72:18)>
             ::_M_manager;
  listFiles(a,(function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)&local_48);
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  return (bool)local_19[0];
}

Assistant:

bool compareDir(const std::string& a, const std::string& b)
{
    bool ok = true;
    listFiles(a, [&](const std::string& fileName) {
        auto base = fileName.substr(a.size());
        auto other = b + base;
        if (fileExists(other)) {
            if (!compareFile(fileName, other)) {
                printf("%s and %s differ\n", fileName.c_str(), other.c_str());

                ok = false;
            }

        } else {
            printf("%s does not exist\n", other.c_str());
            ok = false;
        }
    });
    return ok;
}